

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexBenchmarks.hpp
# Opt level: O3

void benchmarks::MutexBenchmarks<descriptors::mutex::std::Mutex>::Basic(BenchmarkContext *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong count;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  StorageArray<std::mutex> m;
  IOperationProfilerPtr op;
  string local_60;
  StorageArray<std::mutex> local_40;
  anon_class_8_1_54a3980d local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  count = context->_iterationsCount;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = count;
  uVar3 = SUB168(auVar2 * ZEXT816(0x28),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar3 = uVar4;
  }
  local_40._size = count;
  puVar5 = (ulong *)operator_new__(uVar3);
  *puVar5 = count;
  local_40._arr = (Storage<std::mutex> *)(puVar5 + 1);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"create","");
  local_30.m = &local_40;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::std::Mutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_60,count,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"mutex","");
  (*context->_vptr_BenchmarkContext[2])(context,&local_60,count);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"lock","");
  local_30.m = &local_40;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::std::Mutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,&local_60,count,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"unlock","");
  local_30.m = &local_40;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::std::Mutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_3_>
            (context,&local_60,count,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"destroy","");
  (*context->_vptr_BenchmarkContext[3])(&local_30,context,&local_60,count);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40._arr != (Storage<std::mutex> *)0x0) {
    operator_delete__((ulong *)((long)local_40._arr + -8));
  }
  return;
}

Assistant:

static void Basic(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<MutexType> m(n);

            context.Profile("create", n, [&]{ m.Construct(); });
            context.MeasureMemory("mutex", n);
            context.Profile("lock", n, [&]{ m.ForEach([](MutexType& m){ m.lock(); }); });
            context.Profile("unlock", n, [&]{ m.ForEach([](MutexType& m){ m.unlock(); }); });
            context.Profile("destroy", n, [&]{ m.Destruct(); });
        }